

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_send_stream(quicly_stream_t *stream,quicly_send_context_t *s)

{
  quicly_ranges_t *ranges;
  uint64_t *puVar1;
  ulong start;
  quicly_conn_t *pqVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t new_bytes;
  quicly_sent_t *pqVar12;
  size_t min_space;
  ulong uVar13;
  long lVar14;
  uint8_t *puVar15;
  byte *__dest;
  byte *pbVar16;
  quicly_sent_t *pqVar17;
  size_t __n;
  int wrote_all;
  size_t len;
  quicly_sent_t *sent;
  uint8_t header [18];
  int local_5c;
  ulong local_58;
  quicly_sent_t *local_50;
  byte local_48;
  byte bStack_47;
  undefined6 uStack_46;
  
  start = ((stream->sendstate).pending.ranges)->start;
  uVar10 = stream->stream_id;
  bVar7 = (byte)(start >> 8);
  if ((long)uVar10 < 0) {
    min_space = 4;
    if ((0x3f < start) && (min_space = 5, 0x3fff < start)) {
      min_space = (ulong)(0x3fffffff < start) * 4 + 7;
    }
    iVar8 = allocate_ack_eliciting_frame(stream->conn,s,min_space,&local_50,on_ack_stream);
    if (iVar8 != 0) {
      return iVar8;
    }
    puVar15 = s->dst;
    s->dst = puVar15 + 1;
    *puVar15 = '\x06';
    pbVar16 = s->dst;
    if (0x3f < start) {
      if (start < 0x4000) {
        *pbVar16 = bVar7 | 0x40;
        pbVar16 = pbVar16 + 1;
      }
      else {
        quicly_send_stream_cold_3();
        pbVar16 = (byte *)CONCAT62(uStack_46,CONCAT11(bStack_47,local_48));
      }
    }
    *pbVar16 = (byte)start;
    pbVar16 = pbVar16 + 1;
    s->dst = pbVar16;
    uVar10 = (long)s->dst_end - (long)pbVar16;
    __dest = (byte *)0x0;
  }
  else {
    pqVar12 = (quicly_sent_t *)&bStack_47;
    if (0x3f < uVar10) {
      if (uVar10 < 0x4000) {
        bStack_47 = (byte)(uVar10 >> 8) | 0x40;
        pqVar12 = (quicly_sent_t *)&uStack_46;
      }
      else {
        quicly_send_stream_cold_1();
        pqVar12 = local_50;
      }
    }
    pqVar17 = (quicly_sent_t *)((long)&pqVar12->acked + 1);
    *(byte *)&pqVar12->acked = (byte)uVar10;
    if (start == 0) {
      local_48 = 8;
    }
    else {
      local_48 = 0xc;
      if (0x3f < start) {
        if (start < 0x4000) {
          *(byte *)((long)&pqVar12->acked + 1) = bVar7 | 0x40;
          pqVar17 = (quicly_sent_t *)((long)&pqVar12->acked + 2);
        }
        else {
          quicly_send_stream_cold_2();
          pqVar17 = local_50;
        }
      }
      *(byte *)&pqVar17->acked = (byte)start;
      pqVar17 = (quicly_sent_t *)((long)&pqVar17->acked + 1);
    }
    uVar10 = (stream->sendstate).final_size;
    if (start == uVar10 && uVar10 != 0xffffffffffffffff) {
      local_48 = local_48 | 1;
      pbVar16 = (byte *)((long)pqVar17 - (long)&local_48);
      iVar8 = allocate_ack_eliciting_frame(stream->conn,s,(size_t)pbVar16,&local_50,on_ack_stream);
      if (iVar8 != 0) {
        return iVar8;
      }
      puVar15 = s->dst;
      if (pbVar16 != s->dst_end + -(long)puVar15) {
        local_48 = local_48 | 2;
        *(byte *)&pqVar17->acked = 0;
        puVar15 = s->dst;
        pbVar16 = (byte *)((long)pqVar17 + (1 - (long)&local_48));
      }
      memcpy(puVar15,&local_48,(size_t)pbVar16);
      s->dst = s->dst + (long)pbVar16;
      local_5c = 1;
      lVar9 = 1;
      uVar10 = start;
      goto LAB_0011a1b4;
    }
    __n = (long)pqVar17 - (long)&local_48;
    iVar8 = allocate_ack_eliciting_frame(stream->conn,s,__n + 1,&local_50,on_ack_stream);
    if (iVar8 != 0) {
      return iVar8;
    }
    __dest = s->dst;
    memcpy(__dest,&local_48,__n);
    pbVar16 = s->dst + __n;
    s->dst = pbVar16;
    uVar11 = (long)s->dst_end - (long)pbVar16;
    uVar4 = (stream->_send_aux).max_stream_data;
    uVar10 = uVar4 - start;
    if (uVar11 + start <= uVar4) {
      uVar10 = uVar11;
    }
    uVar4 = (stream->sendstate).size_inflight;
    if ((uVar4 < uVar10 + start) &&
       (uVar5 = (stream->conn->egress).max_data.permitted,
       uVar6 = (stream->conn->egress).max_data.sent, uVar5 - uVar6 < (uVar10 + start) - uVar4)) {
      uVar10 = (uVar4 + uVar5) - (uVar6 + start);
    }
  }
  uVar4 = (stream->sendstate).final_size;
  uVar11 = ((stream->sendstate).pending.ranges)->end;
  uVar13 = uVar11 - start;
  if (uVar4 < uVar11 && uVar4 != 0xffffffffffffffff) {
    if (uVar13 < 2) {
      __assert_fail("range_capacity > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xda6,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
    }
    uVar13 = uVar13 - 1;
  }
  if (uVar10 < uVar13) {
    uVar13 = uVar10;
  }
  if (uVar13 == 0) {
    __assert_fail("capacity != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xdae,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  local_58 = uVar13;
  (*stream->callbacks->on_send_emit)
            (stream,start - ((stream->sendstate).acked.ranges)->end,pbVar16,&local_58,&local_5c);
  if (QUICLY_STATE_CONNECTED < (stream->conn->super).state) {
    return 0xff06;
  }
  if ((stream->_send_aux).reset_stream.sender_state != QUICLY_SENDER_STATE_NONE) {
    return 0;
  }
  if (uVar13 < local_58) {
    __assert_fail("len <= capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xdb8,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  if (local_58 == 0) {
    __assert_fail("len != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xdb9,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  if (__dest == (byte *)0x0) {
LAB_0011a3a2:
    lVar9 = 1;
    if ((0x3f < local_58) && (lVar9 = 2, 0x3fff < local_58)) {
      lVar9 = (ulong)(0x3fffffff < local_58) * 4 + 4;
    }
    puVar15 = s->dst;
    uVar10 = (long)s->dst_end - (long)puVar15;
    if (uVar10 < lVar9 + local_58) {
      local_58 = uVar10 - lVar9;
      local_5c = 0;
    }
    memmove(puVar15 + lVar9,puVar15,local_58);
    uVar10 = local_58;
    pbVar16 = s->dst;
    if (0x3f < local_58) {
      if (local_58 < 0x4000) {
        *pbVar16 = (byte)(local_58 >> 8) | 0x40;
        pbVar16 = pbVar16 + 1;
      }
      else {
        quicly_send_stream_cold_4();
        pbVar16 = (byte *)CONCAT62(uStack_46,CONCAT11(bStack_47,local_48));
      }
    }
    *pbVar16 = (byte)uVar10;
    pbVar16 = pbVar16 + 1;
  }
  else {
    pbVar16 = s->dst;
    if (local_58 < (ulong)((long)s->dst_end - (long)pbVar16)) {
      *__dest = *__dest | 2;
      goto LAB_0011a3a2;
    }
  }
  s->dst = pbVar16 + local_58;
  uVar10 = local_58 + start;
  uVar5 = (stream->sendstate).final_size;
  lVar9 = 0;
  if ((uVar5 != 0xffffffffffffffff) && (uVar10 == uVar5)) {
    if (__dest == (byte *)0x0) {
      __assert_fail("frame_type_at != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xdcc,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
    }
    *__dest = *__dest | 1;
    lVar9 = 1;
  }
LAB_0011a1b4:
  pqVar2 = stream->conn;
  lVar3 = stream->stream_id;
  puVar1 = &(pqVar2->super).stats.num_frames_sent.crypto + (ulong)(-1 < lVar3) * 2;
  *puVar1 = *puVar1 + 1;
  ranges = &(stream->sendstate).pending;
  puVar1 = &(stream->sendstate).size_inflight;
  lVar14 = uVar10 - *puVar1;
  if (*puVar1 <= uVar10 && lVar14 != 0) {
    if (-1 < lVar3) {
      puVar1 = &(pqVar2->egress).max_data.sent;
      *puVar1 = *puVar1 + lVar14;
    }
    (stream->sendstate).size_inflight = uVar10;
  }
  iVar8 = quicly_ranges_subtract(ranges,start,uVar10 + lVar9);
  if (iVar8 == 0) {
    if ((local_5c != 0) &&
       (iVar8 = quicly_ranges_subtract(ranges,(stream->sendstate).size_inflight,0xffffffffffffffff),
       iVar8 != 0)) {
      return iVar8;
    }
    (local_50->data).packet.packet_number = stream->stream_id;
    (local_50->data).ack.range.end = start;
    (local_50->data).stream.args.end = uVar10 + lVar9;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int quicly_send_stream(quicly_stream_t *stream, quicly_send_context_t *s)
{
    uint64_t off = stream->sendstate.pending.ranges[0].start, end_off;
    quicly_sent_t *sent;
    uint8_t *frame_type_at;
    size_t capacity, len;
    int ret, wrote_all, is_fin;

    /* write frame type, stream_id and offset, calculate capacity */
    if (stream->stream_id < 0) {
        if ((ret = allocate_ack_eliciting_frame(stream->conn, s,
                                                1 + quicly_encodev_capacity(off) + 2 /* type + len + offset + 1-byte payload */,
                                                &sent, on_ack_stream)) != 0)
            return ret;
        frame_type_at = NULL;
        *s->dst++ = QUICLY_FRAME_TYPE_CRYPTO;
        s->dst = quicly_encodev(s->dst, off);
        capacity = s->dst_end - s->dst;
    } else {
        uint8_t header[18], *hp = header + 1;
        hp = quicly_encodev(hp, stream->stream_id);
        if (off != 0) {
            header[0] = QUICLY_FRAME_TYPE_STREAM_BASE | QUICLY_FRAME_TYPE_STREAM_BIT_OFF;
            hp = quicly_encodev(hp, off);
        } else {
            header[0] = QUICLY_FRAME_TYPE_STREAM_BASE;
        }
        if (!quicly_sendstate_is_open(&stream->sendstate) && off == stream->sendstate.final_size) {
            /* special case for emitting FIN only */
            header[0] |= QUICLY_FRAME_TYPE_STREAM_BIT_FIN;
            if ((ret = allocate_ack_eliciting_frame(stream->conn, s, hp - header, &sent, on_ack_stream)) != 0)
                return ret;
            if (hp - header != s->dst_end - s->dst) {
                header[0] |= QUICLY_FRAME_TYPE_STREAM_BIT_LEN;
                *hp++ = 0; /* empty length */
            }
            memcpy(s->dst, header, hp - header);
            s->dst += hp - header;
            end_off = off;
            wrote_all = 1;
            is_fin = 1;
            goto UpdateState;
        }
        if ((ret = allocate_ack_eliciting_frame(stream->conn, s, hp - header + 1, &sent, on_ack_stream)) != 0)
            return ret;
        frame_type_at = s->dst;
        memcpy(s->dst, header, hp - header);
        s->dst += hp - header;
        capacity = s->dst_end - s->dst;
        /* cap by max_stream_data */
        if (off + capacity > stream->_send_aux.max_stream_data)
            capacity = stream->_send_aux.max_stream_data - off;
        /* cap by max_data */
        if (off + capacity > stream->sendstate.size_inflight) {
            uint64_t new_bytes = off + capacity - stream->sendstate.size_inflight;
            if (new_bytes > stream->conn->egress.max_data.permitted - stream->conn->egress.max_data.sent) {
                size_t max_stream_data =
                    stream->sendstate.size_inflight + stream->conn->egress.max_data.permitted - stream->conn->egress.max_data.sent;
                capacity = max_stream_data - off;
            }
        }
    }
    { /* cap the capacity to the current range */
        uint64_t range_capacity = stream->sendstate.pending.ranges[0].end - off;
        if (!quicly_sendstate_is_open(&stream->sendstate) && off + range_capacity > stream->sendstate.final_size) {
            assert(range_capacity > 1); /* see the special case above */
            range_capacity -= 1;
        }
        if (capacity > range_capacity)
            capacity = range_capacity;
    }

    /* write payload */
    assert(capacity != 0);
    len = capacity;
    size_t emit_off = (size_t)(off - stream->sendstate.acked.ranges[0].end);
    QUICLY_PROBE(STREAM_ON_SEND_EMIT, stream->conn, stream->conn->stash.now, stream, emit_off, len);
    stream->callbacks->on_send_emit(stream, emit_off, s->dst, &len, &wrote_all);
    if (stream->conn->super.state >= QUICLY_STATE_CLOSING) {
        return QUICLY_ERROR_IS_CLOSING;
    } else if (stream->_send_aux.reset_stream.sender_state != QUICLY_SENDER_STATE_NONE) {
        return 0;
    }
    assert(len <= capacity);
    assert(len != 0);

    /* update s->dst, insert length if necessary */
    if (frame_type_at == NULL || len < s->dst_end - s->dst) {
        if (frame_type_at != NULL)
            *frame_type_at |= QUICLY_FRAME_TYPE_STREAM_BIT_LEN;
        size_t len_of_len = quicly_encodev_capacity(len);
        if (len_of_len + len > s->dst_end - s->dst) {
            len = s->dst_end - s->dst - len_of_len;
            wrote_all = 0;
        }
        memmove(s->dst + len_of_len, s->dst, len);
        s->dst = quicly_encodev(s->dst, len);
    }
    s->dst += len;
    end_off = off + len;

    /* determine if the frame incorporates FIN */
    if (!quicly_sendstate_is_open(&stream->sendstate) && end_off == stream->sendstate.final_size) {
        assert(frame_type_at != NULL);
        is_fin = 1;
        *frame_type_at |= QUICLY_FRAME_TYPE_STREAM_BIT_FIN;
    } else {
        is_fin = 0;
    }

UpdateState:
    if (stream->stream_id < 0) {
        ++stream->conn->super.stats.num_frames_sent.crypto;
    } else {
        ++stream->conn->super.stats.num_frames_sent.stream;
    }
    QUICLY_PROBE(STREAM_SEND, stream->conn, stream->conn->stash.now, stream, off, end_off - off, is_fin);
    QUICLY_PROBE(QUICTRACE_SEND_STREAM, stream->conn, stream->conn->stash.now, stream, off, end_off - off, is_fin);
    /* update sendstate (and also MAX_DATA counter) */
    if (stream->sendstate.size_inflight < end_off) {
        if (stream->stream_id >= 0)
            stream->conn->egress.max_data.sent += end_off - stream->sendstate.size_inflight;
        stream->sendstate.size_inflight = end_off;
    }
    if ((ret = quicly_ranges_subtract(&stream->sendstate.pending, off, end_off + is_fin)) != 0)
        return ret;
    if (wrote_all) {
        if ((ret = quicly_ranges_subtract(&stream->sendstate.pending, stream->sendstate.size_inflight, UINT64_MAX)) != 0)
            return ret;
    }

    /* setup sentmap */
    sent->data.stream.stream_id = stream->stream_id;
    sent->data.stream.args.start = off;
    sent->data.stream.args.end = end_off + is_fin;

    return 0;
}